

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.hpp
# Opt level: O1

void * __thiscall Diligent::BufferVkImpl::GetCPUAddress(BufferVkImpl *this)

{
  char (*in_RCX) [63];
  string msg;
  string local_30;
  
  if (1 < (byte)((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 .m_Desc.Usage - USAGE_STAGING)) {
    FormatString<char[26],char[63]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Desc.Usage == USAGE_STAGING || m_Desc.Usage == USAGE_UNIFIED",
               in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetCPUAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/BufferVkImpl.hpp"
               ,100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (void *)((long)((this->m_MemoryAllocation).Page)->m_CPUMemory +
                 this->m_BufferMemoryAlignedOffset);
}

Assistant:

void* GetCPUAddress()
    {
        VERIFY_EXPR(m_Desc.Usage == USAGE_STAGING || m_Desc.Usage == USAGE_UNIFIED);
        return reinterpret_cast<Uint8*>(m_MemoryAllocation.Page->GetCPUMemory()) + m_BufferMemoryAlignedOffset;
    }